

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall
mocker::detail::InterferenceGraph::build
          (InterferenceGraph *this,LineIter funcBeg,LineIter funcEnd,
          function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *pushWorklist,
          function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *updateAssociatedMove)

{
  pointer *this_00;
  bool bVar1;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>_>
  *this_01;
  reference __k;
  mapped_type *pmVar2;
  pointer pLVar3;
  reference psVar4;
  NasmCfg *cfg_00;
  pair<std::_List_const_iterator<mocker::nasm::Line>,_std::_List_const_iterator<mocker::nasm::Line>_>
  pVar5;
  shared_ptr<mocker::nasm::Register> local_228;
  shared_ptr<mocker::nasm::Register> local_218;
  reference local_208;
  shared_ptr<mocker::nasm::Register> *l;
  iterator __end5;
  iterator __begin5;
  mapped_type *__range5;
  shared_ptr<mocker::nasm::Register> *d;
  iterator __end4;
  iterator __begin4;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  *__range4;
  shared_ptr<mocker::nasm::Mov> mov;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  uses;
  vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
  defs;
  undefined1 local_180 [8];
  shared_ptr<mocker::nasm::Inst> inst;
  reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> riter;
  reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> local_150;
  reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> rend;
  reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> local_130;
  reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> rbeg;
  mapped_type live;
  Node *bb;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *bbIdent;
  value_type *kv;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>_>
  *__range2;
  anon_class_1_0_00000001 dycMov;
  undefined1 local_b0 [8];
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
  liveOut;
  undefined1 local_68 [8];
  NasmCfg cfg;
  function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *updateAssociatedMove_local;
  function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *pushWorklist_local;
  InterferenceGraph *this_local;
  LineIter funcEnd_local;
  LineIter funcBeg_local;
  
  liveOut._M_h._M_single_bucket = (__node_base_ptr)funcEnd._M_node;
  cfg.nodes._M_h._M_single_bucket = (__node_base_ptr)updateAssociatedMove;
  buildNasmCfg((NasmCfg *)local_68,funcBeg,funcEnd);
  buildLiveOut_abi_cxx11_
            ((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
              *)local_b0,(mocker *)local_68,cfg_00);
  this_01 = NasmCfg::getNodes_abi_cxx11_((NasmCfg *)local_68);
  __end2 = std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>_>
           ::begin(this_01);
  kv = (value_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>_>_>
       ::end(this_01);
  while (bVar1 = std::__detail::operator!=
                           (&__end2.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_true>
                            ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_true>
                              *)&kv), bVar1) {
    __k = std::__detail::
          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_false,_true>
          ::operator*(&__end2);
    pmVar2 = std::
             unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
             ::at((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
                   *)local_b0,&__k->first);
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::unordered_set((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&rbeg,pmVar2);
    pVar5 = NasmCfg::Node::getLines(&__k->second);
    rend.current._M_node = pVar5.first._M_node;
    std::make_reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>>
              ((_List_node_base *)&local_130);
    NasmCfg::Node::getLines(&__k->second);
    std::make_reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>>
              ((_List_node_base *)&local_150);
    std::reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_>::reverse_iterator
              ((reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> *)
               &inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               &local_130);
    while (bVar1 = std::operator!=((reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_>
                                    *)&inst.
                                       super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_refcount,&local_150), bVar1) {
      pLVar3 = std::reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_>::operator->
                         ((reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> *)
                          &inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
      std::shared_ptr<mocker::nasm::Inst>::shared_ptr
                ((shared_ptr<mocker::nasm::Inst> *)local_180,&pLVar3->inst);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_180);
      if (bVar1) {
        nasm::getDefinedRegs
                  ((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&uses.
                       super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                   (shared_ptr<mocker::nasm::Inst> *)local_180);
        nasm::getUsedRegs((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                           *)&mov.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount,(shared_ptr<mocker::nasm::Inst> *)local_180);
        build::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)&__range4,
                   (shared_ptr<mocker::nasm::Inst> *)((long)&__range2 + 3));
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&__range4);
        if (bVar1) {
          subSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                    ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)&rbeg,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                               *)&mov.
                                  super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
          std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::operator()
                    ((function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)> *)
                     cfg.nodes._M_h._M_single_bucket,(shared_ptr<mocker::nasm::Mov> *)&__range4);
          std::function<void_(const_std::shared_ptr<mocker::nasm::Mov>_&)>::operator()
                    (pushWorklist,(shared_ptr<mocker::nasm::Mov> *)&__range4);
        }
        std::shared_ptr<mocker::nasm::Mov>::~shared_ptr((shared_ptr<mocker::nasm::Mov> *)&__range4);
        unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&rbeg,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)&uses.
                                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        this_00 = &uses.
                   super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        __end4 = std::
                 vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                 ::begin((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                          *)this_00);
        d = (shared_ptr<mocker::nasm::Register> *)
            std::
            vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
            ::end((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end4,(__normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                                           *)&d), bVar1) {
          psVar4 = __gnu_cxx::
                   __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
                   ::operator*(&__end4);
          __end5 = std::
                   unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   ::begin((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                            *)&rbeg);
          l = (shared_ptr<mocker::nasm::Register> *)
              std::
              unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
              ::end((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                     *)&rbeg);
          while (bVar1 = std::__detail::operator!=
                                   (&__end5.
                                     super__Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>
                                    ,(_Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true>
                                      *)&l), bVar1) {
            local_208 = std::__detail::
                        _Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
                        operator*(&__end5);
            std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_218,local_208);
            std::shared_ptr<mocker::nasm::Register>::shared_ptr(&local_228,psVar4);
            addEdge(this,&local_218,&local_228);
            std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_228);
            std::shared_ptr<mocker::nasm::Register>::~shared_ptr(&local_218);
            std::__detail::_Node_iterator<std::shared_ptr<mocker::nasm::Register>,_true,_true>::
            operator++(&__end5);
          }
          __gnu_cxx::
          __normal_iterator<std::shared_ptr<mocker::nasm::Register>_*,_std::vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>
          ::operator++(&__end4);
        }
        subSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&rbeg,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)&uses.
                                super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
        unionSet<std::unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>,std::vector<std::shared_ptr<mocker::nasm::Register>,std::allocator<std::shared_ptr<mocker::nasm::Register>>>>
                  ((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                    *)&rbeg,(vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                             *)&mov.
                                super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)&mov.super___shared_ptr<mocker::nasm::Mov,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        std::
        vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
        ::~vector((vector<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                   *)&uses.
                      super__Vector_base<std::shared_ptr<mocker::nasm::Register>,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::shared_ptr<mocker::nasm::Inst>::~shared_ptr((shared_ptr<mocker::nasm::Inst> *)local_180);
      std::reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_>::operator++
                ((reverse_iterator<std::_List_const_iterator<mocker::nasm::Line>_> *)
                 &inst.super___shared_ptr<mocker::nasm::Inst,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
    ::~unordered_set((unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
                      *)&rbeg);
    std::__detail::
    _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::NasmCfg::Node>,_false,_true>
    ::operator++(&__end2);
  }
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>_>_>_>
                    *)local_b0);
  NasmCfg::~NasmCfg((NasmCfg *)local_68);
  return;
}

Assistant:

void InterferenceGraph::build(
    LineIter funcBeg, LineIter funcEnd,
    const std::function<void(const MovInst &)> &pushWorklist,
    const std::function<void(const MovInst &)> &updateAssociatedMove) {
  auto cfg = buildNasmCfg(funcBeg, funcEnd);
  auto liveOut = buildLiveOut(cfg);

  auto dycMov = [](const std::shared_ptr<nasm::Inst> &inst)
      -> std::shared_ptr<nasm::Mov> {
    auto mov = nasm::dyc<nasm::Mov>(inst);
    if (!mov || !nasm::dyc<nasm::Register>(mov->getOperand()) ||
        !nasm::dyc<nasm::Register>(mov->getDest()))
      return nullptr;
    return mov;
  };

  for (auto &kv : cfg.getNodes()) {
    auto &bbIdent = kv.first;
    auto &bb = kv.second;
    auto live = liveOut.at(bbIdent);
    auto rbeg = std::make_reverse_iterator(bb.getLines().second);
    auto rend = std::make_reverse_iterator(bb.getLines().first);
    for (auto riter = rbeg; riter != rend; ++riter) {
      auto inst = riter->inst;
      if (!inst)
        continue;
      auto defs = nasm::getDefinedRegs(inst);
      auto uses = nasm::getUsedRegs(inst);

      if (auto mov = dycMov(inst)) {
        subSet(live, uses);
        updateAssociatedMove(mov);
        pushWorklist(mov);
      }

      unionSet(live, defs);
      for (auto &d : defs) {
        for (auto &l : live)
          addEdge(l, d);
      }
      subSet(live, defs);
      unionSet(live, uses);
    }
  }
}